

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDie::dump(DWARFDie *this,raw_ostream *OS,uint Indent,DIDumpOptions DumpOpts)

{
  Form Form;
  void *pvVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  DIDumpOptions DumpOpts_00;
  undefined1 auVar4 [16];
  DIDumpOptions DumpOpts_01;
  uint64_t uVar5;
  DWARFAbbreviationDeclaration *pDVar6;
  raw_ostream *prVar7;
  uint uVar8;
  long lVar9;
  DWARFDie Die;
  undefined1 local_110 [8];
  DWARFDataExtractor debug_info_data;
  undefined8 local_e0;
  WithColor local_60;
  Tag local_4a;
  char *local_48;
  uint64_t offset;
  raw_ostream *local_38;
  
  if ((this->U != (DWARFUnit *)0x0) && (this->Die != (DWARFDebugInfoEntry *)0x0)) {
    DWARFUnit::getDebugInfoExtractor((DWARFDataExtractor *)local_110,this->U);
    local_48 = (char *)getOffset(this);
    if (DumpOpts.ShowParents == true) {
      Die = getParent(this);
      lVar9 = (ulong)DumpOpts._18_6_ << 0x10;
      auVar4 = DumpOpts._0_16_;
      DumpOpts_00.ShowChildren = (bool)(char)lVar9;
      DumpOpts_00.ShowParents = (bool)(char)((ulong)lVar9 >> 8);
      DumpOpts_00.ShowForm = (bool)(char)((ulong)lVar9 >> 0x10);
      DumpOpts_00.SummarizeTypes = (bool)(char)((ulong)lVar9 >> 0x18);
      DumpOpts_00.Verbose = (bool)(char)((ulong)lVar9 >> 0x20);
      DumpOpts_00.DisplayRawContents = (bool)(char)((ulong)lVar9 >> 0x28);
      DumpOpts_00._22_2_ = (short)((ulong)lVar9 >> 0x30);
      DumpOpts_00.DumpType = auVar4._0_4_;
      DumpOpts_00.ChildRecurseDepth = auVar4._4_4_;
      DumpOpts_00.ParentRecurseDepth = auVar4._8_4_;
      DumpOpts_00.Version = auVar4._12_2_;
      DumpOpts_00.AddrSize = auVar4[0xe];
      DumpOpts_00.ShowAddresses = (bool)auVar4[0xf];
      Indent = dumpParentChain(Die,OS,Indent,DumpOpts_00,0);
    }
    if (local_48 < debug_info_data.super_DataExtractor.Data.Data) {
      local_38 = OS;
      uVar5 = DataExtractor::getULEB128
                        ((DataExtractor *)local_110,(uint64_t *)&local_48,(Error *)0x0);
      if (DumpOpts.ShowAddresses == true) {
        WithColor::WithColor(&local_60,local_38,Address,false);
        local_e0 = "\n0x%8.8lx: ";
        debug_info_data.Section = (DWARFSection *)&PTR_home_01127cf0;
        raw_ostream::operator<<(local_60.OS,(format_object_base *)&debug_info_data.Section);
        WithColor::~WithColor(&local_60);
      }
      if ((int)uVar5 == 0) {
        prVar7 = raw_ostream::indent(local_38,Indent);
        raw_ostream::operator<<(prVar7,"NULL\n");
      }
      else {
        pDVar6 = getAbbreviationDeclarationPtr(this);
        if (pDVar6 == (DWARFAbbreviationDeclaration *)0x0) {
          prVar7 = raw_ostream::operator<<
                             (local_38,
                              "Abbreviation code not found in \'debug_abbrev\' class for code: ");
          prVar7 = raw_ostream::operator<<(prVar7,uVar5 & 0xffffffff);
          raw_ostream::operator<<(prVar7,'\n');
        }
        else {
          WithColor::WithColor(&local_60,local_38,Tag,false);
          offset = (uint64_t)raw_ostream::indent(local_60.OS,Indent);
          local_4a = getTag(this);
          formatv<llvm::dwarf::Tag>
                    ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>
                      *)&debug_info_data.Section,"{0}",&local_4a);
          raw_ostream::operator<<
                    ((raw_ostream *)offset,(formatv_object_base *)&debug_info_data.Section);
          offset = CONCAT44(offset._4_4_,Indent);
          formatv_object_base::~formatv_object_base((formatv_object_base *)&debug_info_data.Section)
          ;
          WithColor::~WithColor(&local_60);
          if (DumpOpts.Verbose == true) {
            local_e0 = " [%u] %c";
            debug_info_data.Section = (DWARFSection *)&PTR_home_011284b8;
            raw_ostream::operator<<(local_38,(format_object_base *)&debug_info_data.Section);
          }
          prVar7 = local_38;
          raw_ostream::operator<<(local_38,'\n');
          pvVar1 = (pDVar6->AttributeSpecs).
                   super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                   super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                   .
                   super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                   .super_SmallVectorBase.BeginX;
          uVar8 = (pDVar6->AttributeSpecs).
                  super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                  super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                  .
                  super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                  .super_SmallVectorBase.Size;
          for (lVar9 = 0; (ulong)uVar8 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
            Form = *(Form *)((long)pvVar1 + lVar9 + 2);
            if (Form != DW_FORM_implicit_const) {
              dumpAttribute(prVar7,this,(uint64_t *)&local_48,*(Attribute *)((long)pvVar1 + lVar9),
                            Form,(uint)offset,DumpOpts);
            }
          }
          join_0x00000010_0x00000000_ = getFirstChild(this);
          if (((DumpOpts.ShowChildren & DumpOpts.ChildRecurseDepth != 0) != 0) &&
             (debug_info_data._40_8_ != (DWARFDebugInfoEntry *)0x0 &&
              debug_info_data.Section != (DWARFUnit *)0x0)) {
            uVar8 = (uint)offset + 2;
            while ((debug_info_data.Section != (DWARFUnit *)0x0 &&
                   (debug_info_data._40_8_ != (DWARFDebugInfoEntry *)0x0))) {
              DumpOpts_01.ChildRecurseDepth = DumpOpts.ChildRecurseDepth - 1;
              DumpOpts_01.DumpType = DumpOpts.DumpType;
              uVar2 = DumpOpts._8_8_;
              uVar3 = DumpOpts._18_4_;
              DumpOpts_01.ShowParents = false;
              DumpOpts_01.ShowChildren = DumpOpts.ShowChildren;
              DumpOpts_01.ShowForm = (bool)(char)uVar3;
              DumpOpts_01.SummarizeTypes = (bool)(char)((uint)uVar3 >> 8);
              DumpOpts_01.Verbose = (bool)(char)((uint)uVar3 >> 0x10);
              DumpOpts_01.DisplayRawContents = (bool)(char)((uint)uVar3 >> 0x18);
              DumpOpts_01._22_2_ = DumpOpts._22_2_;
              DumpOpts_01.ParentRecurseDepth = (int)uVar2;
              DumpOpts_01.Version = (short)((ulong)uVar2 >> 0x20);
              DumpOpts_01.AddrSize = (char)((ulong)uVar2 >> 0x30);
              DumpOpts_01.ShowAddresses = (bool)(char)((ulong)uVar2 >> 0x38);
              dump((DWARFDie *)&debug_info_data.Section,prVar7,uVar8,DumpOpts_01);
              join_0x00000010_0x00000000_ = getSibling((DWARFDie *)&debug_info_data.Section);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DWARFDie::dump(raw_ostream &OS, unsigned Indent,
                    DIDumpOptions DumpOpts) const {
  if (!isValid())
    return;
  DWARFDataExtractor debug_info_data = U->getDebugInfoExtractor();
  const uint64_t Offset = getOffset();
  uint64_t offset = Offset;
  if (DumpOpts.ShowParents) {
    DIDumpOptions ParentDumpOpts = DumpOpts;
    ParentDumpOpts.ShowParents = false;
    ParentDumpOpts.ShowChildren = false;
    Indent = dumpParentChain(getParent(), OS, Indent, ParentDumpOpts);
  }

  if (debug_info_data.isValidOffset(offset)) {
    uint32_t abbrCode = debug_info_data.getULEB128(&offset);
    if (DumpOpts.ShowAddresses)
      WithColor(OS, HighlightColor::Address).get()
          << format("\n0x%8.8" PRIx64 ": ", Offset);

    if (abbrCode) {
      auto AbbrevDecl = getAbbreviationDeclarationPtr();
      if (AbbrevDecl) {
        WithColor(OS, HighlightColor::Tag).get().indent(Indent)
            << formatv("{0}", getTag());
        if (DumpOpts.Verbose)
          OS << format(" [%u] %c", abbrCode,
                       AbbrevDecl->hasChildren() ? '*' : ' ');
        OS << '\n';

        // Dump all data in the DIE for the attributes.
        for (const auto &AttrSpec : AbbrevDecl->attributes()) {
          if (AttrSpec.Form == DW_FORM_implicit_const) {
            // We are dumping .debug_info section ,
            // implicit_const attribute values are not really stored here,
            // but in .debug_abbrev section. So we just skip such attrs.
            continue;
          }
          dumpAttribute(OS, *this, &offset, AttrSpec.Attr, AttrSpec.Form,
                        Indent, DumpOpts);
        }

        DWARFDie child = getFirstChild();
        if (DumpOpts.ShowChildren && DumpOpts.ChildRecurseDepth > 0 && child) {
          DumpOpts.ChildRecurseDepth--;
          DIDumpOptions ChildDumpOpts = DumpOpts;
          ChildDumpOpts.ShowParents = false;
          while (child) {
            child.dump(OS, Indent + 2, ChildDumpOpts);
            child = child.getSibling();
          }
        }
      } else {
        OS << "Abbreviation code not found in 'debug_abbrev' class for code: "
           << abbrCode << '\n';
      }
    } else {
      OS.indent(Indent) << "NULL\n";
    }
  }
}